

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.h
# Opt level: O2

optional<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
* __thiscall
viras::iter::
ValsIter<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_1U>
::next(optional<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
       *__return_storage_ptr__,
      ValsIter<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_1U>
      *this)

{
  if (this->_cur == 0) {
    this->_cur = 1;
    std::
    _Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
    ::
    _Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
              ((_Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
                *)__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
    .
    super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

auto next() -> std::optional<A>
      { return _cur < N ? std::optional<A>(std::move(_vals[_cur++]))
                        : std::optional<A>(); }